

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall TPZMatrix<int>::Simetrize(TPZMatrix<int> *this)

{
  undefined4 uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  lVar3 = (this->super_TPZBaseMatrix).fRow;
  if (lVar3 != (this->super_TPZBaseMatrix).fCol) {
    Error("Simetrize only work for square matrices",(char *)0x0);
    lVar3 = (this->super_TPZBaseMatrix).fRow;
  }
  if (0 < lVar3) {
    lVar4 = 0;
    do {
      lVar5 = lVar4 + 1;
      for (lVar6 = lVar5; lVar6 < lVar3; lVar6 = lVar6 + 1) {
        iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                          (this,lVar4,lVar6);
        uVar1 = *(undefined4 *)CONCAT44(extraout_var,iVar2);
        iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                          (this,lVar6,lVar4);
        *(undefined4 *)CONCAT44(extraout_var_00,iVar2) = uVar1;
      }
      lVar4 = lVar5;
    } while (lVar5 != lVar3);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Simetrize() {
  
  if ( Rows() != Cols() ) {
    Error( "Simetrize only work for square matrices" );
  }
  
  int64_t row,col;
  int64_t fDim1 = Rows();
  for(row=0; row<fDim1; row++) {
    for(col=row+1; col<fDim1; col++) {
      this->s(col,row) = this->s(row,col);
    }
  }
  
}